

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallTargetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  string *psVar1;
  cmGeneratorExpression ge;
  undefined1 local_70 [8];
  undefined1 local_68 [40];
  string local_40;
  
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_68,(cmListFileBacktrace *)(local_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(string *)local_68);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  psVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_70,lg,config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_70);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->Target->GetLocalGenerator(), config);
}